

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O1

void avro::assertType(Entity *e,EntityType et)

{
  Exception *this;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  EntityType local_118;
  EntityType local_114;
  put_holder<char,_std::char_traits<char>_> local_110;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  
  if (e->type_ == et) {
    return;
  }
  local_118 = et;
  this = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f8,"Unexpected type for default value: Expected %1%, but found %2%");
  local_110.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,avro::json::EntityType>;
  local_110.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,avro::json::EntityType>;
  local_110.arg = &local_118;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (&local_f8,&local_110);
  local_114 = e->type_;
  local_110.arg = &local_114;
  local_110.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,avro::json::EntityType_const>;
  local_110.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,avro::json::EntityType_const>;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (pbVar1,&local_110);
  Exception::Exception(this,pbVar1);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void assertType(const Entity& e, EntityType et)
{
    if (e.type() != et) {
        throw Exception(boost::format("Unexpected type for default value: "
            "Expected %1%, but found %2%") % et % e.type());
    }
}